

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O3

mkroom * search_special(level *lev,schar type)

{
  mkroom *pmVar1;
  mkroom *pmVar2;
  char cVar3;
  
  if (-1 < lev->rooms[0].hx) {
    pmVar2 = lev->rooms;
    do {
      cVar3 = pmVar2->rtype;
      if (type == -2) {
        if ('\x11' < cVar3) {
          return pmVar2;
        }
      }
      else if (type == -1) {
        if (cVar3 != '\0') {
          return pmVar2;
        }
        cVar3 = '\0';
      }
      if (cVar3 == type) {
        return pmVar2;
      }
      pmVar1 = pmVar2 + 1;
      pmVar2 = pmVar2 + 1;
    } while (-1 < pmVar1->hx);
  }
  pmVar2 = lev->subrooms;
  cVar3 = pmVar2->hx;
  while( true ) {
    if (cVar3 < '\0') {
      return (mkroom *)0x0;
    }
    cVar3 = pmVar2->rtype;
    if (type == -2) {
      if ('\x11' < cVar3) {
        return pmVar2;
      }
    }
    else if (type == -1) {
      if (cVar3 != '\0') {
        return pmVar2;
      }
      cVar3 = '\0';
    }
    if (cVar3 == type) break;
    cVar3 = pmVar2[1].hx;
    pmVar2 = pmVar2 + 1;
  }
  return pmVar2;
}

Assistant:

struct mkroom *search_special(struct level *lev, schar type)
{
	struct mkroom *croom;

	for (croom = &lev->rooms[0]; croom->hx >= 0; croom++)
	    if ((type == ANY_TYPE && croom->rtype != OROOM) ||
	       (type == ANY_SHOP && croom->rtype >= SHOPBASE) ||
	       croom->rtype == type)
		return croom;
	for (croom = &lev->subrooms[0]; croom->hx >= 0; croom++)
	    if ((type == ANY_TYPE && croom->rtype != OROOM) ||
	       (type == ANY_SHOP && croom->rtype >= SHOPBASE) ||
	       croom->rtype == type)
		return croom;
	return NULL;
}